

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall
RegisterGraphTestCycleInEdgesButNotInNodes3::RegisterGraphTestCycleInEdgesButNotInNodes3
          (RegisterGraphTestCycleInEdgesButNotInNodes3 *this)

{
  RegisterGraphTestCycleInEdgesButNotInNodes3 *this_local;
  
  RegisterTest(GraphTestCycleInEdgesButNotInNodes3::Create,"GraphTest.CycleInEdgesButNotInNodes3");
  return;
}

Assistant:

TEST_F(GraphTest, CycleInEdgesButNotInNodes3) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build a b: cat c\n"
"build c: cat a\n"));
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("b"), NULL, &err));
  ASSERT_EQ("dependency cycle: a -> c -> a", err);
}